

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall
crnlib::symbol_codec::decode(symbol_codec *this,adaptive_bit_model *model,bool update_model)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 in_DL;
  ushort *in_RSI;
  long in_RDI;
  uint bit;
  uint x;
  uint c;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar4;
  
  uVar4 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if (*(uint *)(in_RDI + 0x88) < 0x1000000) {
    uVar1 = get_bits((symbol_codec *)
                     (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffec),in_stack_ffffffffffffffe8)
                     & 0x1ffffffffffffff),in_stack_ffffffffffffffe4);
    *(uint *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) << 8 | uVar1;
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) << 8;
  }
  uVar3 = (uint)*in_RSI * (*(uint *)(in_RDI + 0x88) >> 0xb);
  uVar2 = (uint)(uVar3 <= *(uint *)(in_RDI + 0x84));
  if (uVar2 == 0) {
    if ((uVar4 & 0x1000000) != 0) {
      *in_RSI = *in_RSI + (short)(0x800 - *in_RSI >> 5);
    }
    *(uint *)(in_RDI + 0x88) = uVar3;
  }
  else {
    if ((uVar4 & 0x1000000) != 0) {
      *in_RSI = *in_RSI - (short)((int)(uint)*in_RSI >> 5);
    }
    *(uint *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) - uVar3;
    *(uint *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) - uVar3;
  }
  return uVar2;
}

Assistant:

uint symbol_codec::decode(adaptive_bit_model& model, bool update_model) {
  if (m_arith_length < cSymbolCodecArithMinLen) {
    uint c = get_bits(8);
    m_arith_value = (m_arith_value << 8) | c;

    m_arith_length <<= 8;
    CRNLIB_ASSERT(m_arith_length >= cSymbolCodecArithMinLen);
  }

  CRNLIB_ASSERT(m_arith_length >= cSymbolCodecArithMinLen);

  //uint x = gArithProbMulTab[model.m_bit_0_prob >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
  uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);
  uint bit = (m_arith_value >= x);

  if (!bit) {
    if (update_model)
      model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);

    m_arith_length = x;
  } else {
    if (update_model)
      model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);

    m_arith_value -= x;
    m_arith_length -= x;
  }

  return bit;
}